

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O2

int __thiscall uv::TCPClient::Send(TCPClient *this,char *data,size_t len)

{
  char *pcVar1;
  CStringStream *pCVar2;
  ILog4zManager *pIVar3;
  ssize_t sVar4;
  undefined8 in_RCX;
  size_t __n;
  int iVar5;
  ulong uVar6;
  long *in_FS_OFFSET;
  string local_68;
  CStringStream ss;
  
  __n = CONCAT71((int7)((ulong)in_RCX >> 8),len != 0);
  if (data != (char *)0x0 && len != 0) {
    uv_async_send();
    uVar6 = 0;
    while (this->isuseraskforclosed_ == false) {
      uv_mutex_lock(&this->mutex_writebuf_);
      sVar4 = PodCircularBuffer<char>::write
                        (&this->write_circularbuf_,(int)data + (int)uVar6,
                         (void *)(ulong)(uint)((int)len - (int)uVar6),__n);
      uVar6 = uVar6 + (long)(int)sVar4;
      uv_mutex_unlock(&this->mutex_writebuf_);
      if (len <= uVar6) break;
      usleep(100000);
    }
    iVar5 = (int)uVar6;
    uv_async_send(&this->async_handle_);
  }
  else {
    std::__cxx11::string::assign((char *)&this->errmsg_);
    ss.m_pEnd = (char *)*in_FS_OFFSET;
    pcVar1 = ss.m_pEnd + -0x800;
    ss.m_pBegin = pcVar1;
    ss.m_pCur = pcVar1;
    std::__cxx11::string::string((string *)&local_68,(string *)&this->errmsg_);
    zsummer::log4z::CStringStream::operator<<(&ss,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    pCVar2 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ");
    pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar2,0x131);
    pIVar3 = zsummer::log4z::ILog4zManager::GetInstance();
    iVar5 = 0;
    (*pIVar3->_vptr_ILog4zManager[8])(pIVar3,0,3,pcVar1);
  }
  return iVar5;
}

Assistant:

int TCPClient::Send(const char* data, std::size_t len)
{
    if (!data || len <= 0) {
        errmsg_ = "send data is null or len less than zero.";
        LOGE(errmsg_);
        return 0;
    }
    uv_async_send(&async_handle_);
    size_t iret = 0;
    while (!isuseraskforclosed_) {
        uv_mutex_lock(&mutex_writebuf_);
        iret += write_circularbuf_.write(data + iret, len - iret);
        uv_mutex_unlock(&mutex_writebuf_);
        if (iret < len) {
            ThreadSleep(100);
            continue;
        } else {
            break;
        }
    }
    uv_async_send(&async_handle_);
    return iret;
}